

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int __thiscall Polynomial::createPlusNode(Polynomial *this,int first_loc,int second_loc)

{
  initializer_list<int> __l;
  bool bVar1;
  size_type sVar2;
  value_type_conflict2 local_8c;
  value_type local_88;
  allocator<int> local_51;
  int local_50;
  int local_4c;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> args;
  int val;
  int second_loc_local;
  int first_loc_local;
  Polynomial *this_local;
  
  sVar2 = Catch::clara::std::vector<int,_std::allocator<int>_>::size(&this->mEvaluationValues);
  this->mResultLocation = (int)sVar2;
  bVar1 = isConstantLocation(this,first_loc);
  if ((bVar1) && (bVar1 = isConstantLocation(this,second_loc), bVar1)) {
    args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = first_loc + second_loc;
    if (this->mNumStates <=
        args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_) {
      args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ - this->mNumStates;
    }
    this->mResultLocation =
         args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
  }
  else if (first_loc == 0) {
    this->mResultLocation = second_loc;
  }
  else if (second_loc == 0) {
    this->mResultLocation = first_loc;
  }
  else {
    local_48 = &local_50;
    local_40 = 2;
    local_50 = first_loc;
    local_4c = second_loc;
    std::allocator<int>::allocator(&local_51);
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_38,__l,&local_51);
    Catch::clara::std::allocator<int>::~allocator(&local_51);
    local_88.op = PLUS;
    Catch::clara::std::vector<int,_std::allocator<int>_>::vector
              (&local_88.args,(vector<int,_std::allocator<int>_> *)local_38);
    std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::push_back
              ((vector<Polynomial::operand,_std::allocator<Polynomial::operand>_> *)&this->mOperands
               ,&local_88);
    operand::~operand(&local_88);
    local_8c = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,&local_8c);
    Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_38);
  }
  return this->mResultLocation;
}

Assistant:

int Polynomial::createPlusNode(int first_loc, int second_loc)
{
  mResultLocation = mEvaluationValues.size();
  if (isConstantLocation(first_loc) and isConstantLocation(second_loc))
    {
      // evaluate now, because they are constants
      int val = first_loc + second_loc;
      if (val >= mNumStates) val -= mNumStates;
      mResultLocation = val;
    }
  else if (first_loc == 0)
    mResultLocation = second_loc;
  else if (second_loc == 0)
    mResultLocation = first_loc;
  else
    {
      std::vector<int> args { first_loc, second_loc};
      mOperands.push_back({operandType::PLUS, args});
      mEvaluationValues.push_back(0); // make space in evaluation array for the output.
    }
  return mResultLocation;
}